

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int firstShiftWithOneBit(word x,int blockSize)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (blockSize == 0x10) {
    return 0;
  }
  uVar2 = x >> 0x20;
  uVar3 = (uint)(uVar2 != 0) * 0x20;
  if (blockSize == 8) {
    return (uint)(uVar2 != 0) * -0x20 + 0x40 >> 5;
  }
  if (uVar2 != 0) {
    x = uVar2;
  }
  uVar1 = uVar3 | 0x10;
  if (x < 0x10000) {
    uVar1 = uVar3;
  }
  if (blockSize == 4) {
    return 0x40 - uVar1 >> 4;
  }
  uVar2 = x >> 0x10;
  if (x < 0x10000) {
    uVar2 = x;
  }
  uVar3 = uVar1 | 8;
  if (uVar2 < 0x100) {
    uVar3 = uVar1;
  }
  if (blockSize == 2) {
    return 0x40 - uVar3 >> 3;
  }
  uVar4 = uVar2 >> 8;
  if (uVar2 < 0x100) {
    uVar4 = uVar2;
  }
  uVar1 = uVar3 | 4;
  if (uVar4 < 0x10) {
    uVar1 = uVar3;
  }
  return 0x40 - uVar1 >> 2;
}

Assistant:

int firstShiftWithOneBit(word x, int blockSize)
{
    int n = 0;
    if(blockSize == 16){ return 0;}     
    if (x >= ABC_CONST(0x0000000100000000)) {n = n + 32; x = x >> 32;} 
    if(blockSize == 8){ return (64-n)/32;}  
    if (x >= ABC_CONST(0x0000000000010000)) {n = n + 16; x = x >> 16;} 
    if(blockSize == 4){ return (64-n)/16;}
    if (x >= ABC_CONST(0x0000000000000100)) {n = n + 8; x = x >> 8;}
    if(blockSize == 2){ return (64-n)/8;}
    if (x >= ABC_CONST(0x0000000000000010)) {n = n + 4; x = x >> 4;} 
    return (64-n)/4;    
    
}